

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

upb_MapInsertStatus
upb_Map_Insert(upb_Map *map,upb_MessageValue key,upb_MessageValue val,upb_Arena *arena)

{
  char cVar1;
  uintptr_t key_00;
  _Bool _Var2;
  _Bool _Var3;
  upb_MapInsertStatus uVar4;
  double *pdVar5;
  size_t len;
  char ******key_01;
  uintptr_t intkey;
  upb_value local_60;
  double local_58;
  double dStack_50;
  char *****local_48;
  size_t local_40;
  uintptr_t local_38;
  
  dStack_50 = (double)val.str_val.size;
  local_58 = val.double_val;
  len = key.str_val.size;
  key_01 = (char ******)key.str_val.data;
  local_48 = (char *****)key_01;
  local_40 = len;
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                  ,0x46,
                  "upb_MapInsertStatus upb_Map_Insert(upb_Map *, upb_MessageValue, upb_MessageValue, upb_Arena *)"
                 );
  }
  if (map->is_frozen_dont_copy_me__upb_internal_use_only == true) {
    __assert_fail("!upb_Map_IsFrozen(map)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/map.h"
                  ,0xb0,
                  "upb_MapInsertStatus _upb_Map_Insert(struct upb_Map *, const void *, size_t, void *, size_t, upb_Arena *)"
                 );
  }
  cVar1 = map->key_size;
  local_60.val = 0;
  if (map->val_size == '\0') {
    pdVar5 = (double *)arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)pdVar5) < 0x10) {
      pdVar5 = (double *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x10);
    }
    else {
      if ((double *)((ulong)((long)pdVar5 + 7U) & 0xfffffffffffffff8) != pdVar5) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(pdVar5 + 2);
    }
    if (pdVar5 == (double *)0x0) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
    *pdVar5 = local_58;
    pdVar5[1] = dStack_50;
    local_60.val = (uint64_t)pdVar5;
  }
  else {
    memcpy(&local_60,&local_58,(long)map->val_size);
  }
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    if (cVar1 != '\0') {
      len = (long)cVar1;
      key_01 = &local_48;
    }
    _Var2 = upb_strtable_remove2(&(map->t).strtable,(char *)key_01,len,(upb_value *)0x0);
    _Var3 = upb_strtable_insert(&(map->t).strtable,(char *)key_01,len,local_60,arena);
  }
  else {
    local_38 = 0;
    memcpy(&local_38,&local_48,(long)cVar1);
    key_00 = local_38;
    _Var2 = upb_inttable_remove(&(map->t).inttable,local_38,(upb_value *)0x0);
    _Var3 = upb_inttable_insert(&(map->t).inttable,key_00,local_60,arena);
  }
  uVar4 = kUpb_MapInsertStatus_OutOfMemory;
  if (_Var3 != false) {
    uVar4 = (upb_MapInsertStatus)_Var2;
  }
  return uVar4;
}

Assistant:

upb_MapInsertStatus upb_Map_Insert(upb_Map* map, upb_MessageValue key,
                                   upb_MessageValue val, upb_Arena* arena) {
  UPB_ASSERT(arena);
  return (upb_MapInsertStatus)_upb_Map_Insert(map, &key, map->key_size, &val,
                                              map->val_size, arena);
}